

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

void __thiscall
duckdb::ParquetWriter::PrepareRowGroup
          (ParquetWriter *this,ColumnDataCollection *buffer,PreparedRowGroup *result)

{
  _RowGroup__isset *p_Var1;
  ColumnWriter *pCVar2;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *puVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  reference pvVar7;
  reference this_00;
  type __args;
  reference pvVar8;
  ulong uVar9;
  DataChunk *pDVar10;
  reference pvVar11;
  type pCVar12;
  reference pvVar13;
  pointer pCVar14;
  ulong uVar15;
  ulong uVar16;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *write_state;
  ulong uVar17;
  size_type sVar18;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *puVar19;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
  write_states;
  vector<unsigned_long,_true> column_ids;
  vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> col_writers;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterator __end2;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  local_248;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  long local_210;
  PreparedRowGroup *local_208;
  ParquetWriter *local_200;
  ColumnDataChunkIterationHelper local_1f8;
  void *local_1d8;
  iterator iStack_1d0;
  reference_wrapper<duckdb::ColumnWriter> *local_1c8;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
  *local_1c0;
  ColumnDataChunkIterator local_1b8;
  ColumnDataChunkIterator local_118;
  void *local_78 [3];
  void *local_60 [3];
  void *local_48 [3];
  
  local_200 = this;
  lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(buffer->count);
  (result->row_group).num_rows = lVar6;
  p_Var1 = &(result->row_group).__isset;
  *p_Var1 = (_RowGroup__isset)((byte)*p_Var1 | 2);
  lVar6 = (long)(buffer->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    local_1c0 = (vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
                 *)&result->states;
    uVar16 = (lVar6 >> 3) * -0x5555555555555555;
    local_200 = (ParquetWriter *)&local_200->column_writers;
    local_210 = 0;
    uVar15 = 0;
    local_208 = result;
    do {
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_1c8 = (reference_wrapper<duckdb::ColumnWriter> *)0x0;
      local_1d8 = (void *)0x0;
      iStack_1d0._M_current = (reference_wrapper<duckdb::ColumnWriter> *)0x0;
      local_248.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_248.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
            *)0x0;
      local_248.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
            *)0x0;
      if (uVar16 != uVar15) {
        uVar17 = uVar16 + local_210;
        if (7 < uVar17) {
          uVar17 = 8;
        }
        lVar6 = 0;
        do {
          local_1b8.collection = (ColumnDataCollection *)(uVar15 + lVar6);
          if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
                       (iterator)
                       local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1b8);
          }
          else {
            *local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_1b8.collection;
            local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          pvVar7 = vector<unsigned_long,_true>::back((vector<unsigned_long,_true> *)&local_228);
          this_00 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
                                  *)local_200,*pvVar7);
          __args = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                   ::operator*(this_00);
          if (iStack_1d0._M_current == local_1c8) {
            ::std::
            vector<std::reference_wrapper<duckdb::ColumnWriter>,std::allocator<std::reference_wrapper<duckdb::ColumnWriter>>>
            ::_M_realloc_insert<duckdb::ColumnWriter&>
                      ((vector<std::reference_wrapper<duckdb::ColumnWriter>,std::allocator<std::reference_wrapper<duckdb::ColumnWriter>>>
                        *)&local_1d8,iStack_1d0,__args);
          }
          else {
            (iStack_1d0._M_current)->_M_data = __args;
            iStack_1d0._M_current = iStack_1d0._M_current + 1;
          }
          pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::back
                             ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                              &local_1d8);
          (*pvVar8->_M_data->_vptr_ColumnWriter[2])(&local_1b8,pvVar8->_M_data,local_208);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
                      *)&local_248,
                     (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                      *)&local_1b8);
          if (local_1b8.collection != (ColumnDataCollection *)0x0) {
            (*(code *)(((local_1b8.collection)->allocator).internal.
                       super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->alloc)();
          }
          lVar6 = lVar6 + 1;
        } while (uVar17 + (uVar17 == 0) != lVar6);
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,&local_228);
      ColumnDataCollection::Chunks(&local_1f8,buffer,(vector<unsigned_long,_true> *)local_48);
      if (local_48[0] != (void *)0x0) {
        operator_delete(local_48[0]);
      }
      ColumnDataChunkIterationHelper::begin(&local_1b8,&local_1f8);
      ColumnDataChunkIterationHelper::end(&local_118,&local_1f8);
      uVar9 = local_210 + uVar16;
      uVar17 = 8;
      if (uVar9 < 8) {
        uVar17 = uVar9;
      }
      while (bVar4 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                               (&local_1b8,&local_118), bVar4) {
        pDVar10 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_1b8);
        if (uVar16 != uVar15) {
          sVar18 = 0;
          do {
            pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                               ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                                &local_1d8,sVar18);
            iVar5 = (*pvVar8->_M_data->_vptr_ColumnWriter[3])();
            if ((char)iVar5 != '\0') {
              pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                                 ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                                  &local_1d8,sVar18);
              pCVar2 = pvVar8->_M_data;
              pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                        ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                      *)&local_248,sVar18);
              pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                        ::operator*(pvVar11);
              pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar10->data,sVar18);
              (*pCVar2->_vptr_ColumnWriter[4])(pCVar2,pCVar12,0,pvVar13,pDVar10->count);
            }
            sVar18 = sVar18 + 1;
          } while (uVar17 + (uVar17 == 0) != sVar18);
        }
        ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_1b8);
      }
      if (local_118.scan_chunk.internal.
          super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.scan_chunk.internal.
                   super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_118.scan_state.column_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_118.scan_state);
      if (local_1b8.scan_chunk.internal.
          super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b8.scan_chunk.internal.
                   super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_1b8.scan_state.column_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_1b8.scan_state);
      if (local_1f8.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      puVar19 = local_248.
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = local_248.
               super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (uVar16 != uVar15) {
        uVar17 = 8;
        if (uVar9 < 8) {
          uVar17 = uVar9;
        }
        sVar18 = 0;
        do {
          pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                             ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                              &local_1d8,sVar18);
          iVar5 = (*pvVar8->_M_data->_vptr_ColumnWriter[3])();
          if ((char)iVar5 != '\0') {
            pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                               ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                                &local_1d8,sVar18);
            pCVar2 = pvVar8->_M_data;
            pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                    *)&local_248,sVar18);
            pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                      ::operator*(pvVar11);
            (*pCVar2->_vptr_ColumnWriter[5])(pCVar2,pCVar12);
          }
          sVar18 = sVar18 + 1;
          puVar19 = local_248.
                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar3 = local_248.
                   super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (uVar17 + (uVar17 == 0) != sVar18);
      }
      for (; puVar19 != puVar3; puVar19 = puVar19 + 1) {
        pCVar14 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  ::operator->(puVar19);
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                  (&(pCVar14->definition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>,buffer->count);
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,&local_228);
      ColumnDataCollection::Chunks(&local_1f8,buffer,(vector<unsigned_long,_true> *)local_60);
      if (local_60[0] != (void *)0x0) {
        operator_delete(local_60[0]);
      }
      ColumnDataChunkIterationHelper::begin(&local_1b8,&local_1f8);
      ColumnDataChunkIterationHelper::end(&local_118,&local_1f8);
      uVar17 = 8;
      if (uVar9 < 8) {
        uVar17 = uVar9;
      }
      while (bVar4 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                               (&local_1b8,&local_118), bVar4) {
        pDVar10 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_1b8);
        if (uVar16 != uVar15) {
          sVar18 = 0;
          do {
            pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                               ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                                &local_1d8,sVar18);
            pCVar2 = pvVar8->_M_data;
            pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                    *)&local_248,sVar18);
            pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                      ::operator*(pvVar11);
            pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar10->data,sVar18);
            (*pCVar2->_vptr_ColumnWriter[6])(pCVar2,pCVar12,0,pvVar13,pDVar10->count);
            sVar18 = sVar18 + 1;
          } while (uVar17 + (uVar17 == 0) != sVar18);
        }
        ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_1b8);
      }
      if (local_118.scan_chunk.internal.
          super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.scan_chunk.internal.
                   super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_118.scan_state.column_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_118.scan_state);
      if (local_1b8.scan_chunk.internal.
          super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b8.scan_chunk.internal.
                   super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_1b8.scan_state.column_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_1b8.scan_state);
      if (local_1f8.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (uVar16 != uVar15) {
        uVar17 = 8;
        if (uVar9 < 8) {
          uVar17 = uVar9;
        }
        sVar18 = 0;
        do {
          pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                             ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                              &local_1d8,sVar18);
          pCVar2 = pvVar8->_M_data;
          pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                  *)&local_248,sVar18);
          pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                    ::operator*(pvVar11);
          (*pCVar2->_vptr_ColumnWriter[7])(pCVar2,pCVar12);
          sVar18 = sVar18 + 1;
        } while (uVar17 + (uVar17 == 0) != sVar18);
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,&local_228);
      ColumnDataCollection::Chunks(&local_1f8,buffer,(vector<unsigned_long,_true> *)local_78);
      if (local_78[0] != (void *)0x0) {
        operator_delete(local_78[0]);
      }
      ColumnDataChunkIterationHelper::begin(&local_1b8,&local_1f8);
      ColumnDataChunkIterationHelper::end(&local_118,&local_1f8);
      if (7 < uVar9) {
        uVar9 = 8;
      }
      while (bVar4 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                               (&local_1b8,&local_118), bVar4) {
        pDVar10 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_1b8);
        if (uVar16 != uVar15) {
          sVar18 = 0;
          do {
            pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                               ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                                &local_1d8,sVar18);
            pCVar2 = pvVar8->_M_data;
            pvVar11 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                    *)&local_248,sVar18);
            pCVar12 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                      ::operator*(pvVar11);
            pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar10->data,sVar18);
            (*pCVar2->_vptr_ColumnWriter[8])(pCVar2,pCVar12,pvVar13,pDVar10->count);
            sVar18 = sVar18 + 1;
          } while (uVar9 + (uVar9 == 0) != sVar18);
        }
        ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_1b8);
      }
      if (local_118.scan_chunk.internal.
          super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.scan_chunk.internal.
                   super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_118.scan_state.column_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_118.scan_state);
      if (local_1b8.scan_chunk.internal.
          super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b8.scan_chunk.internal.
                   super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_1b8.scan_state.column_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_1b8.scan_state);
      puVar19 = local_248.
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = local_248.
               super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1f8.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
        puVar19 = local_248.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = local_248.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; puVar19 != puVar3; puVar19 = puVar19 + 1) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>
                  (local_1c0,puVar19);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ::~vector(&local_248);
      if (local_1d8 != (void *)0x0) {
        operator_delete(local_1d8);
      }
      if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar15 = uVar15 + 8;
      uVar16 = ((long)(buffer->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(buffer->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_210 = local_210 + -8;
    } while (uVar15 < uVar16);
  }
  return;
}

Assistant:

void ParquetWriter::PrepareRowGroup(ColumnDataCollection &buffer, PreparedRowGroup &result) {
	// We write 8 columns at a time so that iterating over ColumnDataCollection is more efficient
	static constexpr idx_t COLUMNS_PER_PASS = 8;

	// We want these to be buffer-managed
	D_ASSERT(buffer.GetAllocatorType() == ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR);

	// set up a new row group for this chunk collection
	auto &row_group = result.row_group;
	row_group.num_rows = NumericCast<int64_t>(buffer.Count());
	row_group.__isset.file_offset = true;

	auto &states = result.states;
	// iterate over each of the columns of the chunk collection and write them
	D_ASSERT(buffer.ColumnCount() == column_writers.size());
	for (idx_t col_idx = 0; col_idx < buffer.ColumnCount(); col_idx += COLUMNS_PER_PASS) {
		const auto next = MinValue<idx_t>(buffer.ColumnCount() - col_idx, COLUMNS_PER_PASS);
		vector<column_t> column_ids;
		vector<reference<ColumnWriter>> col_writers;
		vector<unique_ptr<ColumnWriterState>> write_states;
		for (idx_t i = 0; i < next; i++) {
			column_ids.emplace_back(col_idx + i);
			col_writers.emplace_back(*column_writers[column_ids.back()]);
			write_states.emplace_back(col_writers.back().get().InitializeWriteState(row_group));
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				if (col_writers[i].get().HasAnalyze()) {
					col_writers[i].get().Analyze(*write_states[i], nullptr, chunk.data[i], chunk.size());
				}
			}
		}

		for (idx_t i = 0; i < next; i++) {
			if (col_writers[i].get().HasAnalyze()) {
				col_writers[i].get().FinalizeAnalyze(*write_states[i]);
			}
		}

		// Reserving these once at the start really pays off
		for (auto &write_state : write_states) {
			write_state->definition_levels.reserve(buffer.Count());
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				col_writers[i].get().Prepare(*write_states[i], nullptr, chunk.data[i], chunk.size());
			}
		}

		for (idx_t i = 0; i < next; i++) {
			col_writers[i].get().BeginWrite(*write_states[i]);
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				col_writers[i].get().Write(*write_states[i], chunk.data[i], chunk.size());
			}
		}

		for (auto &write_state : write_states) {
			states.push_back(std::move(write_state));
		}
	}
}